

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.hpp
# Opt level: O2

void __thiscall Bezier<3,_2>::derivativePrecompute(Bezier<3,_2> *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long i;
  bool bVar4;
  Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true> local_128;
  Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true> local_f8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>
  local_c8;
  Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true> local_60;
  
  this->derivative_precal_prefix_[0] = 1;
  this->derivative_precal_prefix_[1] = 3;
  uVar1 = 2;
  for (lVar2 = 1; lVar2 != 4; lVar2 = lVar2 + 1) {
    lVar3 = (ulong)uVar1 + 1;
    i = 0;
    while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
      Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>::Block
                (&local_f8,this->derivative_precal_points_ + lVar2 + -1,i + 1);
      Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>::Block
                (&local_128,this->derivative_precal_points_ + lVar2 + -1,i);
      local_c8.m_lhs.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.m_startCol.
      m_value = local_f8.
                super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
                m_startCol.m_value;
      local_c8.m_lhs.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.m_outerStride =
           local_f8.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
           m_outerStride;
      local_c8.m_lhs.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.m_xpr =
           local_f8.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.m_xpr;
      local_c8.m_lhs.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.m_startRow.
      m_value = local_f8.
                super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
                m_startRow.m_value;
      local_c8.m_lhs.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_0>.m_data =
           local_f8.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_0>.m_data;
      local_c8.m_lhs.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_0>._8_8_ =
           local_f8.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_0>._8_8_;
      local_c8.m_rhs.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.m_startCol.
      m_value = local_128.
                super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
                m_startCol.m_value;
      local_c8.m_rhs.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.m_outerStride =
           local_128.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>
           .super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
           m_outerStride;
      local_c8.m_rhs.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.m_xpr =
           local_128.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>
           .super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.m_xpr;
      local_c8.m_rhs.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.m_startRow.
      m_value = local_128.
                super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
                m_startRow.m_value;
      local_c8.m_rhs.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_0>.m_data =
           local_128.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>
           .super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_0>.m_data;
      local_c8.m_rhs.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_0>._8_8_ =
           local_128.super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>
           .super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_0>._8_8_;
      Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>::Block
                (&local_60,this->derivative_precal_points_ + lVar2,i);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true>const,Eigen::Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true>const>>
                (&local_60,&local_c8);
      i = i + 1;
    }
    this->derivative_precal_prefix_[lVar2] =
         (4 - (int)lVar2) * this->derivative_precal_prefix_[lVar2 + -1];
    uVar1 = uVar1 - 1;
  }
  return;
}

Assistant:

void derivativePrecompute() {
    derivative_precal_prefix_[0] = 1;
    derivative_precal_prefix_[1] = N;
    for (int k = 1; k <= N; ++k) {
      int I_range = N - k;
      for (int i = 0; i <= I_range; ++i) {
        derivative_precal_points_[k].col(i) =
            derivative_precal_points_[k - 1].col(i + 1) - derivative_precal_points_[k - 1].col(i);
      }

      derivative_precal_prefix_[k] = derivative_precal_prefix_[k - 1] * (N - k + 1);
    }
  }